

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

PageDesc * page_find_alloc(uc_struct_conflict15 *uc,tb_page_addr_t index,int alloc)

{
  gpointer pvVar1;
  gpointer pvVar2;
  void **ppvVar3;
  int iVar4;
  int iVar5;
  
  ppvVar3 = uc->l1_map + ((long)uc->v_l1_size - 1U & index >> ((byte)uc->v_l1_shift & 0x3f));
  iVar4 = uc->v_l2_levels;
  iVar5 = iVar4 * 10;
  for (; pvVar2 = *ppvVar3, 0 < iVar4; iVar4 = iVar4 + -1) {
    if (pvVar2 == (gpointer)0x0) {
      if (alloc == 0) {
        return (PageDesc *)0x0;
      }
      pvVar1 = g_malloc0(0x2000);
      pvVar2 = *ppvVar3;
      if (pvVar2 == (gpointer)0x0) {
        *ppvVar3 = pvVar1;
        pvVar2 = pvVar1;
      }
      else {
        g_free(pvVar1);
      }
    }
    ppvVar3 = (void **)((long)pvVar2 + (ulong)((uint)(index >> ((byte)iVar5 & 0x3f)) & 0x3ff) * 8);
    iVar5 = iVar5 + -10;
  }
  if (pvVar2 == (gpointer)0x0) {
    if (alloc == 0) {
      return (PageDesc *)0x0;
    }
    pvVar1 = g_malloc0(0x6000);
    pvVar2 = *ppvVar3;
    if (pvVar2 == (gpointer)0x0) {
      *ppvVar3 = pvVar1;
      pvVar2 = pvVar1;
    }
    else {
      g_free(pvVar1);
    }
  }
  return (PageDesc *)((ulong)((uint)index & 0x3ff) * 0x18 + (long)pvVar2);
}

Assistant:

static PageDesc *page_find_alloc(struct uc_struct *uc, tb_page_addr_t index, int alloc)
{
    PageDesc *pd;
    void **lp;
    int i;

    /* Level 1.  Always allocated.  */
    lp = uc->l1_map + ((index >> uc->v_l1_shift) & (uc->v_l1_size - 1));

    /* Level 2..N-1.  */
    for (i = uc->v_l2_levels; i > 0; i--) {
        void **p = *lp;

        if (p == NULL) {
            void *existing;

            if (!alloc) {
                return NULL;
            }
            p = g_new0(void *, V_L2_SIZE);
            existing = *lp;
            if (*lp == NULL) {
                *lp = p;
            }
            if (unlikely(existing)) {
                g_free(p);
                p = existing;
            }
        }

        lp = p + ((index >> (i * V_L2_BITS)) & (V_L2_SIZE - 1));
    }

    pd = *lp;
    if (pd == NULL) {
        void *existing;

        if (!alloc) {
            return NULL;
        }
        pd = g_new0(PageDesc, V_L2_SIZE);
        existing = *lp;
        if (*lp == NULL) {
            *lp = pd;
        }
        if (unlikely(existing)) {
            g_free(pd);
            pd = existing;
        }
    }

    return pd + (index & (V_L2_SIZE - 1));
}